

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

State __thiscall QAccessibleButton::state(QAccessibleButton *this)

{
  long lVar1;
  bool bVar2;
  CheckState CVar3;
  State SVar4;
  QCheckBox *pQVar5;
  QPushButton *pQVar6;
  QMenu *pQVar7;
  QAccessibleWidget *in_RDI;
  long in_FS_OFFSET;
  QPushButton *pb;
  QCheckBox *cb;
  QAbstractButton *b;
  State state;
  QCheckBox *in_stack_ffffffffffffffb8;
  QPushButton *in_stack_ffffffffffffffc0;
  State local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar4 = QAccessibleWidget::state(in_RDI);
  local_10._0_5_ = SVar4._0_5_;
  local_10._5_3_ = 0xaaaaaa;
  button((QAccessibleButton *)0x7edf31);
  pQVar5 = qobject_cast<QCheckBox*>((QObject *)0x7edf40);
  bVar2 = QAbstractButton::isCheckable(&in_stack_ffffffffffffffc0->super_QAbstractButton);
  if (bVar2) {
    local_10 = (State)(CONCAT44(local_10._4_4_,SVar4._0_4_) & 0xffffffffffffffdf | 0x20);
  }
  bVar2 = QAbstractButton::isChecked(&in_stack_ffffffffffffffc0->super_QAbstractButton);
  if (bVar2) {
    local_10 = (State)((ulong)local_10 & 0xffffffffffffffbf | 0x40);
  }
  if ((pQVar5 != (QCheckBox *)0x0) &&
     (CVar3 = QCheckBox::checkState(in_stack_ffffffffffffffb8), CVar3 == PartiallyChecked)) {
    local_10 = (State)((ulong)local_10 & 0xffffffffffffff7f | 0x80);
  }
  bVar2 = QAbstractButton::isDown(&in_stack_ffffffffffffffc0->super_QAbstractButton);
  if (bVar2) {
    local_10 = (State)((ulong)local_10 & 0xffffffffffffffef | 0x10);
  }
  pQVar6 = qobject_cast<QPushButton*>((QObject *)0x7edfd2);
  if (pQVar6 != (QPushButton *)0x0) {
    bVar2 = QPushButton::isDefault(in_stack_ffffffffffffffc0);
    if (bVar2) {
      local_10 = (State)((ulong)local_10 & 0xfffffffffffffbff | 0x400);
    }
    pQVar7 = QPushButton::menu(in_stack_ffffffffffffffc0);
    if (pQVar7 != (QMenu *)0x0) {
      local_10 = (State)((ulong)local_10 & 0xffffffffefffffff | 0x10000000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QAccessible::State QAccessibleButton::state() const
{
    QAccessible::State state = QAccessibleWidget::state();

    QAbstractButton *b = button();
#if QT_CONFIG(checkbox)
    QCheckBox *cb = qobject_cast<QCheckBox *>(b);
#endif
    if (b->isCheckable())
        state.checkable = true;
    if (b->isChecked())
        state.checked = true;
#if QT_CONFIG(checkbox)
    if (cb && cb->checkState() == Qt::PartiallyChecked)
        state.checkStateMixed = true;
#endif
    if (b->isDown())
        state.pressed = true;
#if QT_CONFIG(pushbutton)
    QPushButton *pb = qobject_cast<QPushButton*>(b);
    if (pb) {
        if (pb->isDefault())
            state.defaultButton = true;
#if QT_CONFIG(menu)
        if (pb->menu())
            state.hasPopup = true;
#endif
    }
#endif

    return state;
}